

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5efc::TestCheckArrayCloseFailsOnNotEqual::~TestCheckArrayCloseFailsOnNotEqual
          (TestCheckArrayCloseFailsOnNotEqual *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayCloseFailsOnNotEqual)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
		CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}